

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O0

int dodown(void)

{
  uint uVar1;
  boolean bVar2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  char *local_50;
  char *local_40;
  char *local_38;
  obj *poStack_28;
  boolean can_fall;
  obj *obj;
  boolean ladder_down;
  trap *ptStack_18;
  boolean stairs_down;
  trap *trap;
  
  ptStack_18 = (trap *)0x0;
  if ((((u.ux != (level->dnstair).sx) || (bVar7 = true, u.uy != (level->dnstair).sy)) &&
      (bVar7 = false, u.ux == (level->sstairs).sx)) && (bVar7 = false, u.uy == (level->sstairs).sy))
  {
    bVar7 = (level->sstairs).up == '\0';
  }
  bVar8 = false;
  if (u.ux == (level->dnladder).sx) {
    bVar8 = u.uy == (level->dnladder).sy;
  }
  if ((u.usteed == (monst *)0x0) || ((*(uint *)&(u.usteed)->field_0x60 >> 0x12 & 1) != 0)) {
    if ((u.usteed == (monst *)0x0) || ((u.usteed)->meating == 0)) {
      if (((u.uprops[0x12].intrinsic == 0) && (u.uprops[0x12].extrinsic == 0)) &&
         ((youmonst.data)->mlet != '\x05')) {
        if ((!bVar7) && (!bVar8)) {
          ptStack_18 = t_at(level,(int)u.ux,(int)u.uy);
          bVar7 = false;
          if ((ptStack_18 != (trap *)0x0) && (bVar7 = true, (ptStack_18->field_0x8 & 0x1f) != 0xe))
          {
            bVar7 = (ptStack_18->field_0x8 & 0x1f) == 0xd;
          }
          if ((ptStack_18 == (trap *)0x0) ||
             ((((((ptStack_18->field_0x8 & 0x1f) != 0xe && ((ptStack_18->field_0x8 & 0x1f) != 0xd))
                && ((ptStack_18->field_0x8 & 0x1f) != 0xb)) &&
               ((ptStack_18->field_0x8 & 0x1f) != 0xc)) ||
              (((bVar2 = can_fall_thru(level), bVar2 == '\0' && (bVar7)) ||
               (((byte)ptStack_18->field_0x8 >> 5 & 1) == 0)))))) {
            if (((flags.autodig != '\0') && (flags.nopick == '\0')) &&
               ((uwep != (obj *)0x0 &&
                (((uwep->oclass == '\x02' || (uwep->oclass == '\x06')) &&
                 (objects[uwep->otyp].oc_subtyp == '\x04')))))) {
              iVar4 = use_pick_axe2(uwep,'\0','\0','\x01');
              return iVar4;
            }
            pline("You can\'t go down here.");
            return 0;
          }
        }
        if (u.ustuck == (monst *)0x0) {
          bVar2 = on_level(&dungeon_topology.d_valley_level,&u.uz);
          if ((bVar2 != '\0') && (((ushort)u.uevent._0_2_ >> 10 & 1) == 0)) {
            pline("You are standing at the gate to Gehennom.");
            pline("Unspeakable cruelty and harm lurk down there.");
            cVar3 = yn_function("Are you sure you want to enter?","yn",'n');
            if (cVar3 != 'y') {
              return 0;
            }
            pline("So be it.");
            u.uevent._0_2_ = u.uevent._0_2_ & 0xfbff | 0x400;
          }
          bVar2 = next_to_u();
          if (bVar2 == '\0') {
            pline("You are held back by your pet!");
            trap._4_4_ = 0;
          }
          else {
            if (ptStack_18 != (trap *)0x0) {
              if (((ptStack_18->field_0x8 & 0x1f) == 0xb) || ((ptStack_18->field_0x8 & 0x1f) == 0xc)
                 ) {
                if ((u.utrap == 0) || (u.utraptype != 1)) {
                  u.utrap = 1;
                  u.utraptype = 1;
                  pcVar5 = locomotion(youmonst.data,"go");
                  pline("You %s down into the pit.",pcVar5);
                }
                else {
                  if (((((flags.autodig != '\0') && (flags.nopick == '\0')) && (uwep != (obj *)0x0))
                      && ((uwep->oclass == '\x02' || (uwep->oclass == '\x06')))) &&
                     (objects[uwep->otyp].oc_subtyp == '\x04')) {
                    iVar4 = use_pick_axe2(uwep,'\0','\0','\x01');
                    return iVar4;
                  }
                  pline("You are already in the pit.");
                }
                return 0;
              }
              pcVar5 = locomotion(youmonst.data,"jump");
              pcVar6 = "through the trap door";
              if ((ptStack_18->field_0x8 & 0x1f) == 0xd) {
                pcVar6 = "down the hole";
              }
              pline("You %s %s.",pcVar5,pcVar6);
            }
            if ((ptStack_18 == (trap *)0x0) ||
               (bVar2 = on_level(&u.uz,&dungeon_topology.d_stronghold_level), bVar2 == '\0')) {
              at_ladder = level->locations[u.ux][u.uy].typ == '\x1b';
              next_level((ptStack_18 != (trap *)0x0 ^ 0xffU) & 1);
              at_ladder = '\0';
            }
            else {
              goto_hell('\0','\x01');
            }
            trap._4_4_ = 1;
          }
        }
        else {
          if ((u._1052_1_ & 1) == 0) {
            local_50 = "being held";
          }
          else {
            local_50 = "engulfed";
            if (((u.ustuck)->data->mflags1 & 0x40000) != 0) {
              local_50 = "swallowed";
            }
          }
          pline("You are %s, and cannot go down.",local_50);
          trap._4_4_ = 1;
        }
      }
      else {
        if (((u.uprops[0x12].intrinsic & 0x10000000) != 0) ||
           ((u.uprops[0x12].extrinsic & 0x2000) != 0)) {
          if ((u.uprops[0x12].extrinsic & 0x2000) != 0) {
            for (poStack_28 = invent; poStack_28 != (obj *)0x0; poStack_28 = poStack_28->nobj) {
              if ((poStack_28->oartifact != '\0') &&
                 (bVar2 = artifact_has_invprop(poStack_28,'\x12'), uVar1 = moves, bVar2 != '\0')) {
                if ((uint)poStack_28->age < moves) {
                  iVar4 = rnz(100);
                  poStack_28->age = uVar1 + iVar4;
                }
                else {
                  iVar4 = rnz(100);
                  poStack_28->age = iVar4 + poStack_28->age;
                }
              }
            }
          }
          iVar4 = float_down(0x10ffffff,0x2000);
          if (iVar4 != 0) {
            return 1;
          }
        }
        if (bVar7) {
          local_38 = "stairs";
        }
        else {
          if (bVar8) {
            local_40 = "ladder";
          }
          else {
            local_40 = surface((int)u.ux,(int)u.uy);
          }
          local_38 = local_40;
        }
        floating_above(local_38);
        trap._4_4_ = 0;
      }
    }
    else {
      pcVar5 = Monnam(u.usteed);
      pline("%s is still eating.",pcVar5);
      trap._4_4_ = 0;
    }
  }
  else {
    pcVar5 = Monnam(u.usteed);
    pline("%s won\'t move!",pcVar5);
    trap._4_4_ = 0;
  }
  return trap._4_4_;
}

Assistant:

int dodown(void)
{
	struct trap *trap = 0;
	boolean stairs_down = ((u.ux == level->dnstair.sx && u.uy == level->dnstair.sy) ||
		(u.ux == level->sstairs.sx && u.uy == level->sstairs.sy && !level->sstairs.up)),
		ladder_down = (u.ux == level->dnladder.sx && u.uy == level->dnladder.sy);

	if (u.usteed && !u.usteed->mcanmove) {
		pline("%s won't move!", Monnam(u.usteed));
		return 0;
	} else if (u.usteed && u.usteed->meating) {
		pline("%s is still eating.", Monnam(u.usteed));
		return 0;
	} else if (Levitation) {
	    if ((HLevitation & I_SPECIAL) || (ELevitation & W_ARTI)) {
		/* end controlled levitation */
		if (ELevitation & W_ARTI) {
		    struct obj *obj;

		    for (obj = invent; obj; obj = obj->nobj) {
			if (obj->oartifact &&
					artifact_has_invprop(obj,LEVITATION)) {
			    if (obj->age < moves)
				obj->age = moves + rnz(100);
			    else
				obj->age += rnz(100);
			}
		    }
		}
		if (float_down(I_SPECIAL|TIMEOUT, W_ARTI))
		    return 1;   /* came down, so moved */
	    }
	    floating_above(stairs_down ? "stairs" : ladder_down ?
			   "ladder" : surface(u.ux, u.uy));
	    return 0;   /* didn't move */
	}
	if (!stairs_down && !ladder_down) {
		boolean can_fall;
		trap = t_at(level, u.ux, u.uy);
		can_fall = trap && (trap->ttyp == TRAPDOOR || trap->ttyp == HOLE);
		if (!trap ||
			(trap->ttyp != TRAPDOOR && trap->ttyp != HOLE &&
			 trap->ttyp != PIT && trap->ttyp != SPIKED_PIT)
			|| (!can_fall_thru(level) && can_fall) || !trap->tseen) {

			if (flags.autodig && !flags.nopick &&
				uwep && is_pick(uwep)) {
				return use_pick_axe2(uwep, 0, 0, 1);
			} else {
				pline("You can't go down here.");
				return 0;
			}
		}
	}
	if (u.ustuck) {
		pline("You are %s, and cannot go down.",
			!u.uswallow ? "being held" : is_animal(u.ustuck->data) ?
			"swallowed" : "engulfed");
		return 1;
	}
	if (on_level(&valley_level, &u.uz) && !u.uevent.gehennom_entered) {
		pline("You are standing at the gate to Gehennom.");
		pline("Unspeakable cruelty and harm lurk down there.");
		if (yn("Are you sure you want to enter?") != 'y')
			return 0;
		else pline("So be it.");
		u.uevent.gehennom_entered = 1;	/* don't ask again */
	}

	if (!next_to_u()) {
		pline("You are held back by your pet!");
		return 0;
	}

	if (trap) {
		if (trap->ttyp == PIT || trap->ttyp == SPIKED_PIT) {
			if (u.utrap && (u.utraptype == TT_PIT)) {
				if (flags.autodig && !flags.nopick &&
					uwep && is_pick(uwep)) {
				    return use_pick_axe2(uwep, 0, 0, 1);
				} else {
				    /* YAFM needed */
				    pline("You are already in the pit.");
				}
			} else {
				u.utrap = 1;
				u.utraptype = TT_PIT;
				pline("You %s down into the pit.",
					locomotion(youmonst.data, "go"));
			}
			return 0;
		} else {
			pline("You %s %s.", locomotion(youmonst.data, "jump"),
				trap->ttyp == HOLE ? "down the hole" :
				                     "through the trap door");
		}
	}

	if (trap && Is_stronghold(&u.uz)) {
		goto_hell(FALSE, TRUE);
	} else {
		at_ladder = (boolean) (level->locations[u.ux][u.uy].typ == LADDER);
		next_level(!trap);
		at_ladder = FALSE;
	}
	return 1;
}